

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O1

PassToken __thiscall spvtools::CreateLoopUnrollPass(spvtools *this,bool fully_unroll,int factor)

{
  Pass *this_00;
  undefined8 *puVar1;
  
  this_00 = (Pass *)operator_new(0x38);
  opt::Pass::Pass(this_00);
  this_00->_vptr_Pass = (_func_int **)&PTR__Pass_00b1e9c8;
  this_00->field_0x31 = fully_unroll;
  *(int *)&this_00->field_0x34 = factor;
  puVar1 = (undefined8 *)operator_new(8);
  *puVar1 = this_00;
  *(undefined8 **)this = puVar1;
  return (unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
          )(unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
            )this;
}

Assistant:

Optimizer::PassToken CreateLoopUnrollPass(bool fully_unroll, int factor) {
  return MakeUnique<Optimizer::PassToken::Impl>(
      MakeUnique<opt::LoopUnroller>(fully_unroll, factor));
}